

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Serializer::AggregateCollectiveMetadata
          (BP4Serializer *this,Comm *comm,BufferSTL *bufferSTL,bool inMetadataBuffer)

{
  byte in_CL;
  long in_RDX;
  long *in_RDI;
  BufferSTL *in_stack_00000040;
  Comm *in_stack_00000048;
  BP4Serializer *in_stack_00000050;
  int rank;
  string *process;
  IOChrono *this_00;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  int local_80;
  allocator local_79;
  string local_78 [48];
  string *in_stack_ffffffffffffffb8;
  IOChrono *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,"buffering",(allocator *)&stack0xffffffffffffffbf);
  process = (string *)&stack0xffffffffffffffc0;
  profiling::IOChrono::Start(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)process);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  this_00 = (IOChrono *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"meta_sort_merge",&local_79);
  profiling::IOChrono::Start(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  AggregateCollectiveMetadataIndices(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  local_80 = helper::Comm::Rank((Comm *)0xc26c5f);
  if (local_80 == 0) {
    if ((in_CL & 1) == 0) {
      *(long *)(in_RDX + 0x38) = *(long *)(in_RDX + 0x30) + *(long *)(in_RDX + 0x38);
    }
    else {
      *(undefined8 *)(in_RDX + 0x38) = *(undefined8 *)(in_RDX + 0x30);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"after collective metadata is done",&local_a1);
  BufferSTL::Resize((BufferSTL *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    (string *)in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"meta_sort_merge",&local_c9);
  profiling::IOChrono::Stop(this_00,process);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"buffering",&local_f1);
  profiling::IOChrono::Stop(this_00,process);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

void BP4Serializer::AggregateCollectiveMetadata(helper::Comm const &comm, BufferSTL &bufferSTL,
                                                const bool inMetadataBuffer)
{
    m_Profiler.Start("buffering");
    m_Profiler.Start("meta_sort_merge");

    AggregateCollectiveMetadataIndices(comm, bufferSTL);

    int rank = comm.Rank();
    if (rank == 0)
    {
        if (inMetadataBuffer)
        {
            bufferSTL.m_AbsolutePosition = bufferSTL.m_Position;
        }
        else
        {
            bufferSTL.m_AbsolutePosition += bufferSTL.m_Position;
        }
    }

    bufferSTL.Resize(bufferSTL.m_Position, "after collective metadata is done");

    m_Profiler.Stop("meta_sort_merge");
    m_Profiler.Stop("buffering");
}